

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

VariableID __thiscall spirv_cross::CompilerHLSL::remap_num_workgroups_builtin(CompilerHLSL *this)

{
  ID id;
  uint32_t uVar1;
  SPIRType *pSVar2;
  mapped_type *pmVar3;
  SPIREntryPoint *pSVar4;
  key_type local_420;
  uint32_t block_pointer_type_id;
  undefined1 local_418 [192];
  uint *local_358;
  size_t local_350;
  size_t local_348;
  uint local_340 [8];
  undefined1 local_320 [28];
  TypeID local_304;
  __node_base_ptr *local_300;
  size_type local_2f8;
  __node_base local_2f0;
  size_type sStack_2e8;
  float local_2e0;
  size_t local_2d8;
  __node_base_ptr p_Stack_2d0;
  SPIRType block_pointer_type;
  undefined1 local_178 [192];
  uint *local_b8;
  size_t local_b0;
  size_t local_a8;
  uint local_a0 [8];
  undefined1 local_80 [28];
  TypeID local_64;
  __node_base_ptr *local_60;
  size_type local_58;
  __node_base local_50;
  size_type sStack_48;
  float local_40;
  size_t local_38;
  __node_base_ptr p_Stack_30;
  
  Compiler::update_active_builtins((Compiler *)this);
  uVar1 = 0;
  if (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower & 0x1000000) != 0) {
    uVar1 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,4);
    local_178._32_8_ = local_178 + 0x38;
    local_178._8_8_ = 0x1700000000;
    local_178._0_8_ = &PTR__SPIRType_004e8f68;
    local_178._40_8_ = 0;
    local_178._48_8_ = 8;
    local_178._88_8_ = local_178 + 0x70;
    local_178._96_8_ = 0;
    local_178._104_8_ = 8;
    local_178._120_4_ = 0;
    local_178[0x7c] = false;
    local_178[0x7d] = false;
    local_178._128_4_ = Generic;
    local_178._136_8_ = local_178 + 0xa0;
    local_178._144_8_ = 0;
    local_178._152_8_ = 8;
    local_b8 = local_a0;
    local_b0 = 0;
    local_a8 = 8;
    local_60 = &p_Stack_30;
    local_80._0_7_ = 0;
    local_80._7_4_ = 0;
    local_64.id = 0;
    local_80._12_4_ = 0;
    local_80._16_4_ = ImageFormatUnknown;
    local_80._20_4_ = AccessQualifierReadOnly;
    local_80._24_4_ = 0;
    local_58 = 1;
    local_50._M_nxt = (_Hash_node_base *)0x0;
    sStack_48 = 0;
    local_40 = 1.0;
    local_38 = 0;
    p_Stack_30 = (__node_base_ptr)0x0;
    local_178._16_4_ = UInt;
    local_178._20_4_ = 0x20;
    local_178._24_4_ = 3;
    local_178._28_4_ = 1;
    block_pointer_type_id = uVar1 + 2;
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              ((Compiler *)this,uVar1,(SPIRType *)local_178);
    local_418._32_8_ = local_418 + 0x38;
    local_418._8_4_ = 0;
    local_418._0_8_ = &PTR__SPIRType_004e8f68;
    local_418._12_4_ = 0x1e;
    local_418._20_4_ = 0;
    local_418._24_4_ = 1;
    local_418._40_8_ = 0;
    local_418._48_8_ = 8;
    local_418._88_8_ = local_418 + 0x70;
    local_418._96_8_ = 0;
    local_418._104_8_ = 8;
    local_418._120_4_ = 0;
    local_418[0x7c] = false;
    local_418[0x7d] = false;
    local_418._128_4_ = Generic;
    local_418._136_8_ = local_418 + 0xa0;
    local_418._144_8_ = 0;
    local_418._152_8_ = 8;
    local_358 = local_340;
    local_350 = 0;
    id.id = uVar1 + 1;
    local_348 = 8;
    local_300 = &p_Stack_2d0;
    local_320._0_7_ = 0;
    local_320._7_4_ = 0;
    local_320._12_4_ = 0;
    local_320._16_4_ = ImageFormatUnknown;
    local_320._20_4_ = AccessQualifierReadOnly;
    local_320._24_4_ = 0;
    local_304.id = 0;
    local_2f8 = 1;
    local_2f0._M_nxt = (_Hash_node_base *)0x0;
    sStack_2e8 = 0;
    local_2e0 = 1.0;
    local_2d8 = 0;
    p_Stack_2d0 = (__node_base_ptr)0x0;
    local_418._16_4_ = Struct;
    local_418._28_4_ = local_418._24_4_;
    block_pointer_type.super_IVariant._vptr_IVariant._0_4_ = uVar1;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_418 + 0x88),
               (TypedID<(spirv_cross::Types)1> *)&block_pointer_type);
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              ((Compiler *)this,id.id,(SPIRType *)local_418);
    Compiler::set_decoration((Compiler *)this,id,Block,0);
    ::std::__cxx11::string::string((string *)&block_pointer_type,"count",(allocator *)&local_420);
    Compiler::set_member_name((Compiler *)this,(TypeID)id.id,0,(string *)&block_pointer_type);
    ::std::__cxx11::string::~string((string *)&block_pointer_type);
    Compiler::set_member_decoration((Compiler *)this,(TypeID)id.id,0,DecorationOffset,0);
    SPIRType::SPIRType(&block_pointer_type,(SPIRType *)local_418);
    block_pointer_type.pointer = true;
    block_pointer_type.storage = StorageClassUniform;
    block_pointer_type.parent_type.id = id.id;
    pSVar2 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                       ((Compiler *)this,uVar1 + 2,&block_pointer_type);
    uVar1 = uVar1 + 3;
    (pSVar2->super_IVariant).self.id = id.id;
    local_420.id = 2;
    Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
              ((Compiler *)this,uVar1,&block_pointer_type_id,&local_420.id);
    local_420.id = uVar1;
    pmVar3 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_420);
    ::std::__cxx11::string::assign((char *)pmVar3);
    this->num_workgroups_builtin = uVar1;
    pSVar4 = Compiler::get_entry_point((Compiler *)this);
    local_420.id = this->num_workgroups_builtin;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back
              (&pSVar4->interface_variables,(TypedID<(spirv_cross::Types)2> *)&local_420);
    SPIRType::~SPIRType(&block_pointer_type);
    SPIRType::~SPIRType((SPIRType *)local_418);
    SPIRType::~SPIRType((SPIRType *)local_178);
  }
  return (VariableID)uVar1;
}

Assistant:

VariableID CompilerHLSL::remap_num_workgroups_builtin()
{
	update_active_builtins();

	if (!active_input_builtins.get(BuiltInNumWorkgroups))
		return 0;

	// Create a new, fake UBO.
	uint32_t offset = ir.increase_bound_by(4);

	uint32_t uint_type_id = offset;
	uint32_t block_type_id = offset + 1;
	uint32_t block_pointer_type_id = offset + 2;
	uint32_t variable_id = offset + 3;

	SPIRType uint_type { OpTypeVector };
	uint_type.basetype = SPIRType::UInt;
	uint_type.width = 32;
	uint_type.vecsize = 3;
	uint_type.columns = 1;
	set<SPIRType>(uint_type_id, uint_type);

	SPIRType block_type { OpTypeStruct };
	block_type.basetype = SPIRType::Struct;
	block_type.member_types.push_back(uint_type_id);
	set<SPIRType>(block_type_id, block_type);
	set_decoration(block_type_id, DecorationBlock);
	set_member_name(block_type_id, 0, "count");
	set_member_decoration(block_type_id, 0, DecorationOffset, 0);

	SPIRType block_pointer_type = block_type;
	block_pointer_type.pointer = true;
	block_pointer_type.storage = StorageClassUniform;
	block_pointer_type.parent_type = block_type_id;
	auto &ptr_type = set<SPIRType>(block_pointer_type_id, block_pointer_type);

	// Preserve self.
	ptr_type.self = block_type_id;

	set<SPIRVariable>(variable_id, block_pointer_type_id, StorageClassUniform);
	ir.meta[variable_id].decoration.alias = "SPIRV_Cross_NumWorkgroups";

	num_workgroups_builtin = variable_id;
	get_entry_point().interface_variables.push_back(num_workgroups_builtin);
	return variable_id;
}